

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

SRes LzmaProps_Decode(CLzmaProps *p,Byte *data,uint size)

{
  byte bVar1;
  char cVar2;
  SRes SVar3;
  uint uVar4;
  char cVar5;
  
  SVar3 = 4;
  if (4 < size) {
    uVar4 = 0x1000;
    if (0x1000 < *(uint *)(data + 1)) {
      uVar4 = *(uint *)(data + 1);
    }
    p->dicSize = uVar4;
    bVar1 = *data;
    if (bVar1 < 0xe1) {
      uVar4 = bVar1 / 9;
      cVar2 = (char)uVar4;
      p->lc = bVar1 + cVar2 * -9;
      cVar5 = (char)((uint)bVar1 * 0x6d >> 8);
      p->pb = (byte)(((byte)(bVar1 - cVar5) >> 1) + cVar5) >> 5;
      p->lp = cVar2 + (char)(uVar4 * 0x34 >> 8) * -5;
      SVar3 = 0;
    }
  }
  return SVar3;
}

Assistant:

SRes LzmaProps_Decode(CLzmaProps *p, const Byte *data, unsigned size)
{
  UInt32 dicSize;
  Byte d;
  
  if (size < LZMA_PROPS_SIZE)
    return SZ_ERROR_UNSUPPORTED;
  else
    dicSize = data[1] | ((UInt32)data[2] << 8) | ((UInt32)data[3] << 16) | ((UInt32)data[4] << 24);
 
  if (dicSize < LZMA_DIC_MIN)
    dicSize = LZMA_DIC_MIN;
  p->dicSize = dicSize;

  d = data[0];
  if (d >= (9 * 5 * 5))
    return SZ_ERROR_UNSUPPORTED;

  p->lc = (Byte)(d % 9);
  d /= 9;
  p->pb = (Byte)(d / 5);
  p->lp = (Byte)(d % 5);

  return SZ_OK;
}